

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O0

SQInteger __thiscall SQLexer::GetIDType(SQLexer *this,SQChar *s,SQInteger len)

{
  bool bVar1;
  undefined1 local_38 [8];
  SQObjectPtr t;
  SQInteger len_local;
  SQChar *s_local;
  SQLexer *this_local;
  
  t.super_SQObject._unVal.nInteger = len;
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_38);
  bVar1 = SQTable::GetStr(this->_keywords,s,t.super_SQObject._unVal.nInteger,(SQObjectPtr *)local_38
                         );
  if (bVar1) {
    this_local = (SQLexer *)t.super_SQObject._0_8_;
  }
  else {
    this_local = (SQLexer *)0x102;
  }
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_38);
  return (SQInteger)this_local;
}

Assistant:

SQInteger SQLexer::GetIDType(const SQChar *s,SQInteger len)
{
    SQObjectPtr t;
    if(_keywords->GetStr(s,len, t)) {
        return SQInteger(_integer(t));
    }
    return TK_IDENTIFIER;
}